

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve_2d_sse2.c
# Opt level: O2

void av1_convolve_2d_sr_sse2
               (uint8_t *src,int src_stride,uint8_t *dst,int dst_stride,int w,int h,
               InterpFilterParams *filter_params_x,InterpFilterParams *filter_params_y,
               int subpel_x_qn,int subpel_y_qn,ConvolveParams *conv_params)

{
  int16_t *piVar1;
  int16_t *piVar2;
  int16_t *piVar3;
  int16_t *piVar4;
  int16_t *piVar5;
  int16_t *piVar6;
  ushort uVar7;
  ushort uVar8;
  uint uVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [13];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  undefined1 auVar28 [15];
  undefined1 auVar29 [15];
  undefined1 auVar30 [15];
  undefined1 auVar31 [15];
  undefined1 auVar32 [15];
  undefined1 auVar33 [15];
  undefined1 auVar34 [15];
  undefined1 auVar35 [15];
  undefined1 auVar36 [15];
  undefined1 auVar37 [15];
  undefined1 auVar38 [15];
  undefined1 auVar39 [15];
  undefined1 auVar40 [15];
  undefined1 auVar41 [15];
  undefined1 auVar42 [11];
  undefined1 auVar43 [15];
  undefined1 auVar44 [15];
  undefined1 auVar45 [15];
  undefined1 auVar46 [15];
  undefined1 auVar47 [15];
  undefined1 auVar48 [15];
  undefined1 auVar49 [15];
  undefined1 auVar50 [15];
  undefined1 auVar51 [15];
  undefined1 auVar52 [15];
  undefined1 auVar53 [15];
  undefined1 auVar54 [15];
  undefined1 auVar55 [15];
  undefined1 auVar56 [15];
  undefined1 auVar57 [15];
  undefined1 auVar58 [15];
  undefined1 auVar59 [15];
  undefined1 auVar60 [15];
  undefined1 auVar61 [15];
  undefined1 auVar62 [15];
  undefined1 auVar63 [15];
  undefined1 auVar64 [15];
  undefined1 auVar65 [15];
  undefined1 auVar66 [15];
  undefined1 auVar67 [15];
  undefined1 auVar68 [15];
  undefined1 auVar69 [15];
  undefined1 auVar70 [15];
  undefined1 auVar71 [15];
  undefined1 auVar72 [15];
  undefined1 auVar73 [15];
  undefined1 auVar74 [15];
  undefined1 auVar75 [15];
  undefined1 auVar76 [15];
  undefined1 auVar77 [15];
  undefined1 auVar78 [15];
  undefined1 auVar79 [15];
  undefined1 auVar80 [15];
  undefined1 auVar81 [15];
  undefined1 auVar82 [15];
  undefined1 auVar83 [15];
  undefined1 auVar84 [15];
  undefined1 auVar85 [15];
  undefined1 auVar86 [15];
  undefined1 auVar87 [15];
  undefined1 auVar88 [15];
  undefined1 auVar89 [15];
  undefined1 auVar90 [15];
  undefined1 auVar91 [15];
  undefined1 auVar92 [15];
  undefined1 auVar93 [15];
  undefined1 auVar94 [15];
  undefined1 auVar95 [15];
  undefined1 auVar96 [15];
  undefined1 auVar97 [15];
  undefined1 auVar98 [15];
  undefined1 auVar99 [15];
  undefined1 auVar100 [15];
  undefined1 auVar101 [15];
  undefined1 auVar102 [15];
  undefined1 auVar103 [15];
  undefined1 auVar104 [15];
  undefined1 auVar105 [15];
  undefined1 auVar106 [15];
  undefined1 auVar107 [15];
  undefined1 auVar108 [15];
  undefined1 auVar109 [15];
  undefined1 auVar110 [15];
  undefined1 auVar111 [15];
  undefined1 auVar112 [15];
  undefined1 auVar113 [15];
  undefined1 auVar114 [15];
  undefined1 auVar115 [15];
  undefined1 auVar116 [15];
  undefined1 auVar117 [15];
  undefined1 auVar118 [15];
  undefined1 auVar119 [15];
  undefined1 auVar120 [15];
  undefined1 auVar121 [15];
  undefined1 auVar122 [15];
  undefined1 auVar123 [15];
  undefined1 auVar124 [15];
  undefined1 auVar125 [15];
  undefined1 auVar126 [15];
  undefined1 auVar127 [15];
  undefined1 auVar128 [15];
  undefined1 auVar129 [15];
  undefined1 auVar130 [15];
  undefined1 auVar131 [15];
  undefined1 auVar132 [15];
  undefined1 auVar133 [15];
  undefined1 auVar134 [15];
  undefined1 auVar135 [15];
  undefined1 auVar136 [15];
  undefined1 auVar137 [15];
  undefined1 auVar138 [15];
  undefined1 auVar139 [15];
  undefined1 auVar140 [15];
  undefined1 auVar141 [15];
  undefined1 auVar142 [15];
  undefined1 auVar143 [15];
  undefined1 auVar144 [15];
  undefined1 auVar145 [15];
  undefined1 auVar146 [15];
  undefined1 auVar147 [15];
  undefined1 auVar148 [15];
  undefined1 auVar149 [15];
  undefined1 auVar150 [15];
  undefined1 auVar151 [15];
  undefined1 auVar152 [15];
  undefined1 auVar153 [15];
  undefined1 auVar154 [15];
  undefined1 auVar155 [15];
  undefined1 auVar156 [15];
  undefined1 auVar157 [15];
  undefined1 auVar158 [15];
  undefined1 auVar159 [15];
  undefined4 uVar160;
  undefined4 uVar161;
  undefined4 uVar162;
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [15];
  undefined1 auVar176 [15];
  undefined1 auVar177 [15];
  undefined1 auVar178 [15];
  undefined1 auVar179 [15];
  undefined1 auVar180 [15];
  undefined1 auVar181 [15];
  undefined1 auVar182 [15];
  undefined1 auVar183 [15];
  undefined1 auVar184 [15];
  undefined1 auVar185 [15];
  undefined1 auVar186 [15];
  undefined1 auVar187 [15];
  undefined1 auVar188 [15];
  undefined1 auVar189 [15];
  undefined1 auVar190 [15];
  undefined1 auVar191 [15];
  undefined1 auVar192 [15];
  undefined1 auVar193 [15];
  undefined1 auVar194 [15];
  undefined1 auVar195 [15];
  undefined1 auVar196 [15];
  undefined1 auVar197 [15];
  undefined1 auVar198 [15];
  undefined1 auVar199 [15];
  undefined1 auVar200 [15];
  undefined1 auVar201 [15];
  undefined1 auVar202 [15];
  undefined1 auVar203 [15];
  undefined1 auVar204 [15];
  undefined1 auVar205 [15];
  undefined1 auVar206 [15];
  undefined1 auVar207 [15];
  undefined1 auVar208 [15];
  undefined1 auVar209 [15];
  undefined1 auVar210 [15];
  undefined1 auVar211 [15];
  undefined1 auVar212 [15];
  undefined1 auVar213 [15];
  undefined1 auVar214 [15];
  undefined1 auVar215 [15];
  undefined1 auVar216 [15];
  undefined1 auVar217 [15];
  undefined1 auVar218 [15];
  undefined1 auVar219 [15];
  undefined1 auVar220 [15];
  undefined1 auVar221 [15];
  undefined1 auVar222 [15];
  undefined1 auVar223 [15];
  undefined1 auVar224 [15];
  undefined1 auVar225 [15];
  undefined1 auVar226 [15];
  undefined1 auVar227 [15];
  undefined1 auVar228 [15];
  undefined1 auVar229 [15];
  undefined1 auVar230 [15];
  undefined1 auVar231 [15];
  undefined1 auVar232 [15];
  undefined1 auVar233 [15];
  undefined1 auVar234 [15];
  int iVar235;
  long lVar236;
  int16_t *piVar237;
  byte bVar238;
  uint uVar239;
  ulong uVar241;
  int16_t *piVar242;
  int16_t *piVar243;
  int16_t *piVar244;
  uint uVar245;
  int16_t *piVar246;
  int iVar247;
  long lVar248;
  int16_t *piVar249;
  int16_t *piVar250;
  long lVar251;
  int16_t *piVar252;
  ulong uVar253;
  int16_t *piVar254;
  int16_t *piVar255;
  long lVar256;
  uint8_t *puVar257;
  int16_t *piVar258;
  ulong uVar259;
  int16_t *piVar260;
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined2 uVar287;
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  undefined1 auVar317 [16];
  undefined1 auVar319 [16];
  undefined1 auVar322 [16];
  undefined1 auVar323 [16];
  undefined1 auVar324 [16];
  undefined1 auVar325 [16];
  undefined1 auVar326 [16];
  undefined1 auVar328 [16];
  undefined1 auVar329 [16];
  undefined1 auVar330 [16];
  undefined1 auVar331 [16];
  undefined1 auVar332 [16];
  undefined1 auVar333 [16];
  undefined1 auVar337 [16];
  undefined1 auVar338 [16];
  undefined1 auVar342 [16];
  undefined1 auVar343 [16];
  undefined1 auVar347 [16];
  undefined1 auVar348 [16];
  undefined1 auVar349 [16];
  undefined1 auVar350 [16];
  undefined1 auVar354 [16];
  undefined1 auVar357 [16];
  undefined1 auVar361 [16];
  undefined1 auVar362 [16];
  undefined1 auVar366 [16];
  ulong local_8cc0;
  undefined2 uStack_8cb4;
  undefined2 uStack_8cb2;
  undefined2 uStack_8ca4;
  undefined2 uStack_8ca2;
  undefined2 uStack_8c54;
  undefined2 uStack_8c52;
  undefined2 uStack_8c44;
  undefined2 uStack_8c42;
  longlong local_8b98;
  longlong lStack_8b90;
  undefined8 local_8b88;
  undefined8 uStack_8b80;
  undefined8 local_8b78;
  undefined8 uStack_8b70;
  undefined8 local_8b68;
  undefined8 uStack_8b60;
  undefined8 local_8b58;
  undefined8 uStack_8b50;
  undefined8 local_8b48;
  undefined8 uStack_8b40;
  int16_t im_block [17792];
  ulong uVar240;
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 uVar273;
  undefined1 uVar274;
  undefined1 uVar275;
  undefined1 uVar276;
  undefined1 uVar277;
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined4 uVar288;
  undefined1 uVar296;
  undefined1 uVar297;
  undefined1 uVar304;
  undefined1 uVar305;
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  undefined1 auVar316 [16];
  undefined1 uVar318;
  undefined1 auVar320 [16];
  undefined1 auVar321 [16];
  undefined1 uVar327;
  undefined1 auVar334 [16];
  undefined1 auVar339 [16];
  undefined1 auVar335 [16];
  undefined1 auVar340 [16];
  undefined1 auVar336 [16];
  undefined1 auVar341 [16];
  undefined1 uVar344;
  undefined1 uVar345;
  undefined1 uVar346;
  undefined1 auVar351 [16];
  undefined1 auVar352 [16];
  undefined1 auVar353 [16];
  undefined1 uVar355;
  undefined1 uVar356;
  undefined1 auVar358 [16];
  undefined1 auVar363 [16];
  undefined1 auVar359 [16];
  undefined1 auVar364 [16];
  undefined1 auVar360 [16];
  undefined1 auVar365 [16];
  
  uVar7 = filter_params_x->taps;
  if (uVar7 < 9) {
    uVar8 = filter_params_y->taps;
    uVar9 = conv_params->round_1;
    piVar237 = filter_params_x->filter_ptr + (uint)uVar7 * (subpel_x_qn & 0xfU);
    uVar288 = *(undefined4 *)piVar237;
    uVar160 = *(undefined4 *)(piVar237 + 2);
    uVar161 = *(undefined4 *)(piVar237 + 4);
    uVar162 = *(undefined4 *)(piVar237 + 6);
    bVar238 = (byte)conv_params->round_0;
    uVar239 = 0xe - (conv_params->round_0 + uVar9);
    uVar245 = (h + (uint)uVar8) - 1;
    iVar247 = ((1 << (bVar238 & 0x1f)) >> 1) + 0x4000;
    auVar261._4_4_ = uVar288;
    auVar261._0_4_ = uVar288;
    auVar261._8_4_ = uVar288;
    auVar261._12_4_ = uVar288;
    auVar295._4_4_ = uVar160;
    auVar295._0_4_ = uVar160;
    auVar295._8_4_ = uVar160;
    auVar295._12_4_ = uVar160;
    auVar267._4_4_ = uVar161;
    auVar267._0_4_ = uVar161;
    auVar267._8_4_ = uVar161;
    auVar267._12_4_ = uVar161;
    auVar284._4_4_ = uVar162;
    auVar284._0_4_ = uVar162;
    auVar284._8_4_ = uVar162;
    auVar284._12_4_ = uVar162;
    auVar310 = ZEXT416((uint)conv_params->round_0);
    uVar241 = 0;
    uVar240 = (ulong)uVar245;
    if ((int)uVar245 < 1) {
      uVar240 = uVar241;
    }
    puVar257 = src + (1 - ((long)(int)(((uVar8 >> 1) - 1) * src_stride) + (ulong)(uVar7 >> 1)));
    piVar237 = im_block;
    for (; uVar241 != uVar240; uVar241 = uVar241 + 1) {
      for (lVar236 = 0; lVar236 < w; lVar236 = lVar236 + 8) {
        auVar323 = *(undefined1 (*) [16])(puVar257 + lVar236);
        uVar277 = auVar323[7];
        auVar18[0xd] = 0;
        auVar18._0_13_ = auVar323._0_13_;
        auVar18[0xe] = uVar277;
        uVar276 = auVar323[6];
        auVar39[0xc] = uVar276;
        auVar39._0_12_ = auVar323._0_12_;
        auVar39._13_2_ = auVar18._13_2_;
        auVar60[0xb] = 0;
        auVar60._0_11_ = auVar323._0_11_;
        auVar60._12_3_ = auVar39._12_3_;
        uVar275 = auVar323[5];
        auVar80[10] = uVar275;
        auVar80._0_10_ = auVar323._0_10_;
        auVar80._11_4_ = auVar60._11_4_;
        auVar100[9] = 0;
        auVar100._0_9_ = auVar323._0_9_;
        auVar100._10_5_ = auVar80._10_5_;
        uVar274 = auVar323[4];
        auVar120[8] = uVar274;
        auVar120._0_8_ = auVar323._0_8_;
        auVar120._9_6_ = auVar100._9_6_;
        auVar175._7_8_ = 0;
        auVar175._0_7_ = auVar120._8_7_;
        uVar273 = auVar323[3];
        auVar195._1_8_ = SUB158(auVar175 << 0x40,7);
        auVar195[0] = uVar273;
        auVar195._9_6_ = 0;
        auVar196._1_10_ = SUB1510(auVar195 << 0x30,5);
        auVar196[0] = auVar323[2];
        auVar196._11_4_ = 0;
        auVar140[2] = auVar323[1];
        auVar140._0_2_ = auVar323._0_2_;
        auVar140._3_12_ = SUB1512(auVar196 << 0x20,3);
        auVar270._0_2_ = auVar323._0_2_ & 0xff;
        auVar270._2_13_ = auVar140._2_13_;
        auVar270[0xf] = 0;
        auVar329 = pmaddwd(auVar270,auVar261);
        uVar297 = auVar323[9];
        auVar19[0xd] = 0;
        auVar19._0_13_ = auVar323._2_13_;
        auVar19[0xe] = uVar297;
        uVar296 = auVar323[8];
        auVar40[0xc] = uVar296;
        auVar40._0_12_ = auVar323._2_12_;
        auVar40._13_2_ = auVar19._13_2_;
        auVar61[0xb] = 0;
        auVar61._0_11_ = auVar323._2_11_;
        auVar61._12_3_ = auVar40._12_3_;
        auVar81[10] = uVar277;
        auVar81._0_10_ = auVar323._2_10_;
        auVar81._11_4_ = auVar61._11_4_;
        auVar101[9] = 0;
        auVar101._0_9_ = auVar323._2_9_;
        auVar101._10_5_ = auVar81._10_5_;
        auVar121[8] = uVar276;
        auVar121._0_8_ = auVar323._2_8_;
        auVar121._9_6_ = auVar101._9_6_;
        auVar176._7_8_ = 0;
        auVar176._0_7_ = auVar121._8_7_;
        auVar197._1_8_ = SUB158(auVar176 << 0x40,7);
        auVar197[0] = uVar275;
        auVar197._9_6_ = 0;
        auVar198._1_10_ = SUB1510(auVar197 << 0x30,5);
        auVar198[0] = uVar274;
        auVar198._11_4_ = 0;
        auVar141[2] = uVar273;
        auVar141._0_2_ = auVar323._2_2_;
        auVar141._3_12_ = SUB1512(auVar198 << 0x20,3);
        auVar289._0_2_ = auVar323._2_2_ & 0xff;
        auVar289._2_13_ = auVar141._2_13_;
        auVar289[0xf] = 0;
        auVar331 = pmaddwd(auVar289,auVar295);
        auVar298._0_12_ = auVar323._4_12_;
        auVar298._12_4_ = auVar323._12_4_;
        uVar305 = auVar323[0xb];
        auVar20[0xd] = 0;
        auVar20._0_13_ = auVar298._0_13_;
        auVar20[0xe] = uVar305;
        uVar304 = auVar323[10];
        auVar41[0xc] = uVar304;
        auVar41._0_12_ = auVar298._0_12_;
        auVar41._13_2_ = auVar20._13_2_;
        auVar62[0xb] = 0;
        auVar62._0_11_ = auVar323._4_11_;
        auVar62._12_3_ = auVar41._12_3_;
        auVar82[10] = uVar297;
        auVar82._0_10_ = auVar323._4_10_;
        auVar82._11_4_ = auVar62._11_4_;
        auVar102[9] = 0;
        auVar102._0_9_ = auVar323._4_9_;
        auVar102._10_5_ = auVar82._10_5_;
        auVar122[8] = uVar296;
        auVar122._0_8_ = auVar323._4_8_;
        auVar122._9_6_ = auVar102._9_6_;
        auVar177._7_8_ = 0;
        auVar177._0_7_ = auVar122._8_7_;
        auVar199._1_8_ = SUB158(auVar177 << 0x40,7);
        auVar199[0] = uVar277;
        auVar199._9_6_ = 0;
        auVar200._1_10_ = SUB1510(auVar199 << 0x30,5);
        auVar200[0] = uVar276;
        auVar200._11_4_ = 0;
        auVar142[2] = uVar275;
        auVar142._0_2_ = auVar323._4_2_;
        auVar142._3_12_ = SUB1512(auVar200 << 0x20,3);
        auVar299._0_2_ = auVar323._4_2_ & 0xff;
        auVar299._2_13_ = auVar142._2_13_;
        auVar299[0xf] = 0;
        auVar349 = pmaddwd(auVar299,auVar267);
        auVar21 = auVar323._3_13_;
        auVar22[0xd] = 0;
        auVar22._0_13_ = auVar21 >> 0x18;
        auVar22[0xe] = auVar323[0xd];
        uVar318 = auVar323[0xc];
        auVar43[0xc] = uVar318;
        auVar43._0_12_ = auVar298._0_12_ >> 0x10;
        auVar43._13_2_ = auVar22._13_2_;
        auVar42 = auVar323._5_11_;
        auVar63[0xb] = 0;
        auVar63._0_11_ = auVar42 >> 8;
        auVar63._12_3_ = auVar43._12_3_;
        auVar83[10] = uVar305;
        auVar83._0_10_ = auVar323._6_10_;
        auVar83._11_4_ = auVar63._11_4_;
        auVar103[9] = 0;
        auVar103._0_9_ = auVar323._6_9_;
        auVar103._10_5_ = auVar83._10_5_;
        auVar123[8] = uVar304;
        auVar123._0_8_ = auVar323._6_8_;
        auVar123._9_6_ = auVar103._9_6_;
        auVar178._7_8_ = 0;
        auVar178._0_7_ = auVar123._8_7_;
        auVar201._1_8_ = SUB158(auVar178 << 0x40,7);
        auVar201[0] = uVar297;
        auVar201._9_6_ = 0;
        auVar202._1_10_ = SUB1510(auVar201 << 0x30,5);
        auVar202[0] = uVar296;
        auVar202._11_4_ = 0;
        auVar143[2] = uVar277;
        auVar143._0_2_ = auVar323._6_2_;
        auVar143._3_12_ = SUB1512(auVar202 << 0x20,3);
        auVar306._0_2_ = auVar323._6_2_ & 0xff;
        auVar306._2_13_ = auVar143._2_13_;
        auVar306[0xf] = 0;
        auVar317 = pmaddwd(auVar306,auVar284);
        auVar271._0_4_ =
             auVar329._0_4_ + iVar247 + auVar331._0_4_ + auVar317._0_4_ + auVar349._0_4_ >> auVar310
        ;
        auVar271._4_4_ =
             auVar329._4_4_ + iVar247 + auVar331._4_4_ + auVar317._4_4_ + auVar349._4_4_ >> auVar310
        ;
        auVar271._8_4_ =
             auVar329._8_4_ + iVar247 + auVar331._8_4_ + auVar317._8_4_ + auVar349._8_4_ >> auVar310
        ;
        auVar271._12_4_ =
             auVar329._12_4_ + iVar247 + auVar331._12_4_ + auVar317._12_4_ + auVar349._12_4_ >>
             auVar310;
        auVar23[0xd] = 0;
        auVar23._0_13_ = auVar323._1_13_;
        auVar23[0xe] = uVar296;
        auVar44[0xc] = uVar277;
        auVar44._0_12_ = auVar323._1_12_;
        auVar44._13_2_ = auVar23._13_2_;
        auVar64[0xb] = 0;
        auVar64._0_11_ = auVar323._1_11_;
        auVar64._12_3_ = auVar44._12_3_;
        auVar84[10] = uVar276;
        auVar84._0_10_ = auVar323._1_10_;
        auVar84._11_4_ = auVar64._11_4_;
        auVar104[9] = 0;
        auVar104._0_9_ = auVar323._1_9_;
        auVar104._10_5_ = auVar84._10_5_;
        auVar124[8] = uVar275;
        auVar124._0_8_ = auVar323._1_8_;
        auVar124._9_6_ = auVar104._9_6_;
        auVar179._7_8_ = 0;
        auVar179._0_7_ = auVar124._8_7_;
        auVar203._1_8_ = SUB158(auVar179 << 0x40,7);
        auVar203[0] = uVar274;
        auVar203._9_6_ = 0;
        auVar204._1_10_ = SUB1510(auVar203 << 0x30,5);
        auVar204[0] = uVar273;
        auVar204._11_4_ = 0;
        auVar144[2] = auVar323[2];
        auVar144._0_2_ = auVar323._1_2_;
        auVar144._3_12_ = SUB1512(auVar204 << 0x20,3);
        auVar290._0_2_ = auVar323._1_2_ & 0xff;
        auVar290._2_13_ = auVar144._2_13_;
        auVar290[0xf] = 0;
        auVar329 = pmaddwd(auVar290,auVar261);
        auVar24[0xd] = 0;
        auVar24._0_13_ = auVar21;
        auVar24[0xe] = uVar304;
        auVar45[0xc] = uVar297;
        auVar45._0_12_ = auVar323._3_12_;
        auVar45._13_2_ = auVar24._13_2_;
        auVar65[0xb] = 0;
        auVar65._0_11_ = auVar323._3_11_;
        auVar65._12_3_ = auVar45._12_3_;
        auVar85[10] = uVar296;
        auVar85._0_10_ = auVar323._3_10_;
        auVar85._11_4_ = auVar65._11_4_;
        auVar105[9] = 0;
        auVar105._0_9_ = auVar323._3_9_;
        auVar105._10_5_ = auVar85._10_5_;
        auVar125[8] = uVar277;
        auVar125._0_8_ = auVar323._3_8_;
        auVar125._9_6_ = auVar105._9_6_;
        auVar180._7_8_ = 0;
        auVar180._0_7_ = auVar125._8_7_;
        auVar205._1_8_ = SUB158(auVar180 << 0x40,7);
        auVar205[0] = uVar276;
        auVar205._9_6_ = 0;
        auVar206._1_10_ = SUB1510(auVar205 << 0x30,5);
        auVar206[0] = uVar275;
        auVar206._11_4_ = 0;
        auVar145[2] = uVar274;
        auVar145._0_2_ = auVar323._3_2_;
        auVar145._3_12_ = SUB1512(auVar206 << 0x20,3);
        auVar300._0_2_ = auVar323._3_2_ & 0xff;
        auVar300._2_13_ = auVar145._2_13_;
        auVar300[0xf] = 0;
        auVar331 = pmaddwd(auVar300,auVar295);
        auVar25[0xd] = 0;
        auVar25._0_13_ = auVar21 >> 0x10;
        auVar25[0xe] = uVar318;
        auVar46[0xc] = uVar305;
        auVar46._0_12_ = auVar298._0_12_ >> 8;
        auVar46._13_2_ = auVar25._13_2_;
        auVar66[0xb] = 0;
        auVar66._0_11_ = auVar42;
        auVar66._12_3_ = auVar46._12_3_;
        auVar86[10] = uVar304;
        auVar86._0_10_ = auVar323._5_10_;
        auVar86._11_4_ = auVar66._11_4_;
        auVar106[9] = 0;
        auVar106._0_9_ = auVar323._5_9_;
        auVar106._10_5_ = auVar86._10_5_;
        auVar126[8] = uVar297;
        auVar126._0_8_ = auVar323._5_8_;
        auVar126._9_6_ = auVar106._9_6_;
        auVar181._7_8_ = 0;
        auVar181._0_7_ = auVar126._8_7_;
        auVar207._1_8_ = SUB158(auVar181 << 0x40,7);
        auVar207[0] = uVar296;
        auVar207._9_6_ = 0;
        auVar208._1_10_ = SUB1510(auVar207 << 0x30,5);
        auVar208[0] = uVar277;
        auVar208._11_4_ = 0;
        auVar146[2] = uVar276;
        auVar146._0_2_ = auVar323._5_2_;
        auVar146._3_12_ = SUB1512(auVar208 << 0x20,3);
        auVar307._0_2_ = auVar323._5_2_ & 0xff;
        auVar307._2_13_ = auVar146._2_13_;
        auVar307[0xf] = 0;
        auVar349 = pmaddwd(auVar307,auVar267);
        auVar26[0xd] = 0;
        auVar26._0_13_ = auVar21 >> 0x20;
        auVar26[0xe] = auVar323[0xe];
        auVar47[0xc] = auVar323[0xd];
        auVar47._0_12_ = auVar298._0_12_ >> 0x18;
        auVar47._13_2_ = auVar26._13_2_;
        auVar67[0xb] = 0;
        auVar67._0_11_ = auVar42 >> 0x10;
        auVar67._12_3_ = auVar47._12_3_;
        auVar87[10] = uVar318;
        auVar87._0_10_ = auVar323._6_10_ >> 8;
        auVar87._11_4_ = auVar67._11_4_;
        auVar107[9] = 0;
        auVar107._0_9_ = auVar323._7_9_;
        auVar107._10_5_ = auVar87._10_5_;
        auVar127[8] = uVar305;
        auVar127._0_8_ = auVar323._7_8_;
        auVar127._9_6_ = auVar107._9_6_;
        auVar182._7_8_ = 0;
        auVar182._0_7_ = auVar127._8_7_;
        auVar209._1_8_ = SUB158(auVar182 << 0x40,7);
        auVar209[0] = uVar304;
        auVar209._9_6_ = 0;
        auVar210._1_10_ = SUB1510(auVar209 << 0x30,5);
        auVar210[0] = uVar297;
        auVar210._11_4_ = 0;
        auVar147[2] = uVar296;
        auVar147._0_2_ = auVar323._7_2_;
        auVar147._3_12_ = SUB1512(auVar210 << 0x20,3);
        auVar278._0_2_ = auVar323._7_2_ & 0xff;
        auVar278._2_13_ = auVar147._2_13_;
        auVar278[0xf] = 0;
        auVar323 = pmaddwd(auVar278,auVar284);
        auVar291._0_4_ =
             auVar329._0_4_ + iVar247 + auVar349._0_4_ + auVar331._0_4_ + auVar323._0_4_ >> auVar310
        ;
        auVar291._4_4_ =
             auVar329._4_4_ + iVar247 + auVar349._4_4_ + auVar331._4_4_ + auVar323._4_4_ >> auVar310
        ;
        auVar291._8_4_ =
             auVar329._8_4_ + iVar247 + auVar349._8_4_ + auVar331._8_4_ + auVar323._8_4_ >> auVar310
        ;
        auVar291._12_4_ =
             auVar329._12_4_ + iVar247 + auVar349._12_4_ + auVar331._12_4_ + auVar323._12_4_ >>
             auVar310;
        auVar323 = packssdw(auVar271,auVar291);
        *(undefined1 (*) [16])(piVar237 + lVar236) = auVar323;
      }
      puVar257 = puVar257 + src_stride;
      piVar237 = piVar237 + 0x80;
    }
    bVar238 = 0x16 - bVar238;
    piVar237 = filter_params_y->filter_ptr + (subpel_y_qn & 0xfU) * (uint)uVar8;
    uVar288 = *(undefined4 *)piVar237;
    uVar160 = *(undefined4 *)(piVar237 + 2);
    uVar161 = *(undefined4 *)(piVar237 + 4);
    uVar162 = *(undefined4 *)(piVar237 + 6);
    uStack_8ca4 = (undefined2)uVar288;
    uStack_8ca2 = (undefined2)((uint)uVar288 >> 0x10);
    uStack_8cb4 = (undefined2)uVar160;
    uStack_8cb2 = (undefined2)((uint)uVar160 >> 0x10);
    uStack_8c44 = (undefined2)uVar161;
    uStack_8c42 = (undefined2)((uint)uVar161 >> 0x10);
    uStack_8c54 = (undefined2)uVar162;
    uStack_8c52 = (undefined2)((uint)uVar162 >> 0x10);
    iVar235 = ((1 << ((byte)uVar9 & 0x1f)) >> 1) + (1 << (bVar238 & 0x1f));
    auVar261 = ZEXT416(uVar9);
    iVar247 = 1 << (bVar238 - (byte)uVar9 & 0x1f);
    iVar247 = ((1 << ((byte)uVar239 & 0x1f)) >> 1) - ((iVar247 >> 1) + iVar247);
    auVar295 = ZEXT416(uVar239);
    uVar241 = 0;
    uVar240 = (ulong)(uint)h;
    if (h < 1) {
      uVar240 = 0;
    }
    piVar237 = im_block + 0x380;
    auVar323._4_2_ = uStack_8ca4;
    auVar323._0_4_ = uVar288;
    auVar323._6_2_ = uStack_8ca2;
    auVar323._8_2_ = uStack_8ca4;
    auVar323._10_2_ = uStack_8ca2;
    auVar323._12_2_ = uStack_8ca4;
    auVar323._14_2_ = uStack_8ca2;
    auVar310._4_2_ = uStack_8cb4;
    auVar310._0_4_ = uVar160;
    auVar310._6_2_ = uStack_8cb2;
    auVar310._8_2_ = uStack_8cb4;
    auVar310._10_2_ = uStack_8cb2;
    auVar310._12_2_ = uStack_8cb4;
    auVar310._14_2_ = uStack_8cb2;
    auVar331._4_2_ = uStack_8c44;
    auVar331._0_4_ = uVar161;
    auVar331._6_2_ = uStack_8c42;
    auVar331._8_2_ = uStack_8c44;
    auVar331._10_2_ = uStack_8c42;
    auVar331._12_2_ = uStack_8c44;
    auVar331._14_2_ = uStack_8c42;
    auVar329._4_2_ = uStack_8c54;
    auVar329._0_4_ = uVar162;
    auVar329._6_2_ = uStack_8c52;
    auVar329._8_2_ = uStack_8c54;
    auVar329._10_2_ = uStack_8c52;
    auVar329._12_2_ = uStack_8c54;
    auVar329._14_2_ = uStack_8c52;
    for (; uVar241 != uVar240; uVar241 = uVar241 + 1) {
      for (lVar236 = 0; lVar236 < w; lVar236 = lVar236 + 8) {
        auVar267 = *(undefined1 (*) [16])(piVar237 + lVar236 + -0x380);
        piVar246 = piVar237 + lVar236 + -0x300;
        auVar284 = *(undefined1 (*) [16])(piVar237 + lVar236 + -0x280);
        auVar354._0_12_ = auVar267._0_12_;
        auVar354._12_2_ = auVar267._6_2_;
        auVar354._14_2_ = piVar246[3];
        auVar317._12_4_ = auVar354._12_4_;
        auVar317._0_10_ = auVar267._0_10_;
        auVar317._10_2_ = piVar246[2];
        auVar349._10_6_ = auVar317._10_6_;
        auVar349._0_8_ = auVar267._0_8_;
        auVar349._8_2_ = auVar267._4_2_;
        auVar342._8_8_ = auVar349._8_8_;
        auVar342._6_2_ = piVar246[1];
        auVar342._4_2_ = auVar267._2_2_;
        auVar342._0_2_ = auVar267._0_2_;
        auVar342._2_2_ = *piVar246;
        piVar249 = piVar237 + lVar236 + -0x200;
        auVar360._0_12_ = auVar284._0_12_;
        auVar360._12_2_ = auVar284._6_2_;
        auVar360._14_2_ = piVar249[3];
        auVar359._12_4_ = auVar360._12_4_;
        auVar359._0_10_ = auVar284._0_10_;
        auVar359._10_2_ = piVar249[2];
        auVar358._10_6_ = auVar359._10_6_;
        auVar358._0_8_ = auVar284._0_8_;
        auVar358._8_2_ = auVar284._4_2_;
        auVar357._8_8_ = auVar358._8_8_;
        auVar357._6_2_ = piVar249[1];
        auVar357._4_2_ = auVar284._2_2_;
        auVar357._0_2_ = auVar284._0_2_;
        auVar357._2_2_ = *piVar249;
        auVar349 = *(undefined1 (*) [16])(piVar237 + lVar236 + -0x180);
        piVar250 = piVar237 + lVar236 + -0x100;
        auVar361._0_12_ = auVar349._0_12_;
        auVar361._12_2_ = auVar349._6_2_;
        auVar361._14_2_ = piVar250[3];
        auVar321._12_4_ = auVar361._12_4_;
        auVar321._0_10_ = auVar349._0_10_;
        auVar321._10_2_ = piVar250[2];
        auVar320._10_6_ = auVar321._10_6_;
        auVar320._0_8_ = auVar349._0_8_;
        auVar320._8_2_ = auVar349._4_2_;
        auVar319._8_8_ = auVar320._8_8_;
        auVar319._6_2_ = piVar250[1];
        auVar319._4_2_ = auVar349._2_2_;
        auVar319._0_2_ = auVar349._0_2_;
        auVar319._2_2_ = *piVar250;
        auVar317 = *(undefined1 (*) [16])(piVar237 + lVar236 + -0x80);
        piVar242 = piVar237 + lVar236;
        auVar342 = pmaddwd(auVar342,auVar323);
        auVar361 = pmaddwd(auVar357,auVar310);
        auVar366._0_12_ = auVar317._0_12_;
        auVar366._12_2_ = auVar317._6_2_;
        auVar366._14_2_ = piVar242[3];
        auVar281._12_4_ = auVar366._12_4_;
        auVar281._0_10_ = auVar317._0_10_;
        auVar281._10_2_ = piVar242[2];
        auVar280._10_6_ = auVar281._10_6_;
        auVar280._0_8_ = auVar317._0_8_;
        auVar280._8_2_ = auVar317._4_2_;
        auVar279._8_8_ = auVar280._8_8_;
        auVar279._6_2_ = piVar242[1];
        auVar279._4_2_ = auVar317._2_2_;
        auVar279._0_2_ = auVar317._0_2_;
        auVar279._2_2_ = *piVar242;
        auVar366 = pmaddwd(auVar319,auVar331);
        auVar354 = pmaddwd(auVar279,auVar329);
        auVar308._2_2_ = piVar246[4];
        auVar308._0_2_ = auVar267._8_2_;
        auVar308._4_2_ = auVar267._10_2_;
        auVar308._6_2_ = piVar246[5];
        auVar308._8_2_ = auVar267._12_2_;
        auVar308._10_2_ = piVar246[6];
        auVar308._12_2_ = auVar267._14_2_;
        auVar308._14_2_ = piVar246[7];
        auVar292._2_2_ = piVar249[4];
        auVar292._0_2_ = auVar284._8_2_;
        auVar292._4_2_ = auVar284._10_2_;
        auVar292._6_2_ = piVar249[5];
        auVar292._8_2_ = auVar284._12_2_;
        auVar292._10_2_ = piVar249[6];
        auVar292._12_2_ = auVar284._14_2_;
        auVar292._14_2_ = piVar249[7];
        auVar337._2_2_ = piVar250[4];
        auVar337._0_2_ = auVar349._8_2_;
        auVar337._4_2_ = auVar349._10_2_;
        auVar337._6_2_ = piVar250[5];
        auVar337._8_2_ = auVar349._12_2_;
        auVar337._10_2_ = piVar250[6];
        auVar337._12_2_ = auVar349._14_2_;
        auVar337._14_2_ = piVar250[7];
        auVar301._2_2_ = piVar242[4];
        auVar301._0_2_ = auVar317._8_2_;
        auVar301._4_2_ = auVar317._10_2_;
        auVar301._6_2_ = piVar242[5];
        auVar301._8_2_ = auVar317._12_2_;
        auVar301._10_2_ = piVar242[6];
        auVar301._12_2_ = auVar317._14_2_;
        auVar301._14_2_ = piVar242[7];
        auVar317 = pmaddwd(auVar308,auVar323);
        auVar284 = pmaddwd(auVar292,auVar310);
        auVar267 = pmaddwd(auVar337,auVar331);
        auVar349 = pmaddwd(auVar301,auVar329);
        auVar293._0_4_ =
             (auVar354._0_4_ + auVar366._0_4_ + auVar361._0_4_ + auVar342._0_4_ + iVar235 >>
             auVar261) + iVar247 >> auVar295;
        auVar293._4_4_ =
             (auVar349._0_4_ + auVar267._0_4_ + auVar284._0_4_ + auVar317._0_4_ + iVar235 >>
             auVar261) + iVar247 >> auVar295;
        auVar293._8_4_ =
             (auVar354._4_4_ + auVar366._4_4_ + auVar361._4_4_ + auVar342._4_4_ + iVar235 >>
             auVar261) + iVar247 >> auVar295;
        auVar293._12_4_ =
             (auVar349._4_4_ + auVar267._4_4_ + auVar284._4_4_ + auVar317._4_4_ + iVar235 >>
             auVar261) + iVar247 >> auVar295;
        auVar282._0_4_ =
             (auVar354._8_4_ + auVar366._8_4_ + auVar361._8_4_ + auVar342._8_4_ + iVar235 >>
             auVar261) + iVar247 >> auVar295;
        auVar282._4_4_ =
             (auVar349._8_4_ + auVar267._8_4_ + auVar284._8_4_ + auVar317._8_4_ + iVar235 >>
             auVar261) + iVar247 >> auVar295;
        auVar282._8_4_ =
             (auVar354._12_4_ + auVar366._12_4_ + auVar361._12_4_ + auVar342._12_4_ + iVar235 >>
             auVar261) + iVar247 >> auVar295;
        auVar282._12_4_ =
             (auVar349._12_4_ + auVar267._12_4_ + auVar284._12_4_ + auVar317._12_4_ + iVar235 >>
             auVar261) + iVar247 >> auVar295;
        auVar267 = packssdw(auVar293,auVar282);
        sVar10 = auVar267._0_2_;
        sVar11 = auVar267._2_2_;
        uVar287 = CONCAT11((0 < sVar11) * (sVar11 < 0x100) * auVar267[2] - (0xff < sVar11),
                           (0 < sVar10) * (sVar10 < 0x100) * auVar267[0] - (0xff < sVar10));
        sVar10 = auVar267._4_2_;
        sVar11 = auVar267._6_2_;
        uVar288 = CONCAT13((0 < sVar11) * (sVar11 < 0x100) * auVar267[6] - (0xff < sVar11),
                           CONCAT12((0 < sVar10) * (sVar10 < 0x100) * auVar267[4] - (0xff < sVar10),
                                    uVar287));
        sVar10 = auVar267._8_2_;
        sVar11 = auVar267._10_2_;
        sVar12 = auVar267._12_2_;
        sVar13 = auVar267._14_2_;
        if (w == 4) {
          *(undefined4 *)(dst + lVar236) = uVar288;
        }
        else if (w == 2) {
          *(undefined2 *)(dst + lVar236) = uVar287;
        }
        else {
          *(ulong *)(dst + lVar236) =
               CONCAT17((0 < sVar13) * (sVar13 < 0x100) * auVar267[0xe] - (0xff < sVar13),
                        CONCAT16((0 < sVar12) * (sVar12 < 0x100) * auVar267[0xc] - (0xff < sVar12),
                                 CONCAT15((0 < sVar11) * (sVar11 < 0x100) * auVar267[10] -
                                          (0xff < sVar11),
                                          CONCAT14((0 < sVar10) * (sVar10 < 0x100) * auVar267[8] -
                                                   (0xff < sVar10),uVar288))));
        }
      }
      dst = dst + dst_stride;
      piVar237 = piVar237 + 0x80;
    }
  }
  else {
    if (w < 8) {
      av1_convolve_2d_sr_c
                (src,src_stride,dst,dst_stride,w,h,filter_params_x,filter_params_y,subpel_x_qn,
                 subpel_y_qn,conv_params);
      return;
    }
    uVar239 = (h + (uint)filter_params_y->taps) - 1;
    uVar240 = (ulong)uVar239;
    lVar236 = (long)(int)(((filter_params_y->taps >> 1) - 1) * src_stride);
    lVar256 = 1 - (ulong)(uVar7 >> 1);
    iVar247 = conv_params->round_0;
    uVar9 = conv_params->round_1;
    auVar261 = ZEXT416((uint)conv_params->round_0);
    prepare_coeffs_12tap(filter_params_x,subpel_x_qn,(__m128i *)&local_8b98);
    bVar238 = (byte)iVar247;
    iVar235 = ((1 << (bVar238 & 0x1f)) >> 1) + 0x4000;
    auVar169._8_8_ = lStack_8b90;
    auVar169._0_8_ = local_8b98;
    auVar170._8_8_ = uStack_8b80;
    auVar170._0_8_ = local_8b88;
    auVar171._8_8_ = uStack_8b70;
    auVar171._0_8_ = local_8b78;
    auVar172._8_8_ = uStack_8b60;
    auVar172._0_8_ = local_8b68;
    auVar173._8_8_ = uStack_8b50;
    auVar173._0_8_ = local_8b58;
    auVar174._8_8_ = uStack_8b40;
    auVar174._0_8_ = local_8b48;
    uVar259 = (ulong)(uint)w;
    uVar241 = 0;
    if ((int)uVar239 < 1) {
      uVar240 = 0;
    }
    puVar257 = src + (lVar256 - lVar236);
    piVar237 = im_block;
    lVar248 = 0x400000000;
    for (; uVar241 != uVar240; uVar241 = uVar241 + 1) {
      lVar251 = lVar248;
      for (uVar253 = 0; uVar253 < uVar259; uVar253 = uVar253 + 8) {
        auVar295 = *(undefined1 (*) [16])(puVar257 + uVar253);
        auVar267 = *(undefined1 (*) [16])(src + (lVar251 >> 0x20) + (lVar256 - lVar236));
        uVar277 = auVar295[7];
        auVar27[0xd] = 0;
        auVar27._0_13_ = auVar295._0_13_;
        auVar27[0xe] = uVar277;
        uVar276 = auVar295[6];
        auVar48[0xc] = uVar276;
        auVar48._0_12_ = auVar295._0_12_;
        auVar48._13_2_ = auVar27._13_2_;
        auVar68[0xb] = 0;
        auVar68._0_11_ = auVar295._0_11_;
        auVar68._12_3_ = auVar48._12_3_;
        uVar275 = auVar295[5];
        auVar88[10] = uVar275;
        auVar88._0_10_ = auVar295._0_10_;
        auVar88._11_4_ = auVar68._11_4_;
        auVar108[9] = 0;
        auVar108._0_9_ = auVar295._0_9_;
        auVar108._10_5_ = auVar88._10_5_;
        uVar274 = auVar295[4];
        auVar128[8] = uVar274;
        auVar128._0_8_ = auVar295._0_8_;
        auVar128._9_6_ = auVar108._9_6_;
        auVar183._7_8_ = 0;
        auVar183._0_7_ = auVar128._8_7_;
        uVar273 = auVar295[3];
        auVar211._1_8_ = SUB158(auVar183 << 0x40,7);
        auVar211[0] = uVar273;
        auVar211._9_6_ = 0;
        auVar212._1_10_ = SUB1510(auVar211 << 0x30,5);
        auVar212[0] = auVar295[2];
        auVar212._11_4_ = 0;
        auVar148[2] = auVar295[1];
        auVar148._0_2_ = auVar295._0_2_;
        auVar148._3_12_ = SUB1512(auVar212 << 0x20,3);
        auVar283._0_2_ = auVar295._0_2_ & 0xff;
        auVar283._2_13_ = auVar148._2_13_;
        auVar283[0xf] = 0;
        auVar284 = pmaddwd(auVar283,auVar169);
        auVar28[0xd] = 0;
        auVar28._0_13_ = auVar295._2_13_;
        auVar28[0xe] = auVar295[9];
        uVar296 = auVar295[8];
        auVar49[0xc] = uVar296;
        auVar49._0_12_ = auVar295._2_12_;
        auVar49._13_2_ = auVar28._13_2_;
        auVar69[0xb] = 0;
        auVar69._0_11_ = auVar295._2_11_;
        auVar69._12_3_ = auVar49._12_3_;
        auVar89[10] = uVar277;
        auVar89._0_10_ = auVar295._2_10_;
        auVar89._11_4_ = auVar69._11_4_;
        auVar109[9] = 0;
        auVar109._0_9_ = auVar295._2_9_;
        auVar109._10_5_ = auVar89._10_5_;
        auVar129[8] = uVar276;
        auVar129._0_8_ = auVar295._2_8_;
        auVar129._9_6_ = auVar109._9_6_;
        auVar184._7_8_ = 0;
        auVar184._0_7_ = auVar129._8_7_;
        auVar213._1_8_ = SUB158(auVar184 << 0x40,7);
        auVar213[0] = uVar275;
        auVar213._9_6_ = 0;
        auVar214._1_10_ = SUB1510(auVar213 << 0x30,5);
        auVar214[0] = uVar274;
        auVar214._11_4_ = 0;
        auVar149[2] = uVar273;
        auVar149._0_2_ = auVar295._2_2_;
        auVar149._3_12_ = SUB1512(auVar214 << 0x20,3);
        auVar309._0_2_ = auVar295._2_2_ & 0xff;
        auVar309._2_13_ = auVar149._2_13_;
        auVar309[0xf] = 0;
        auVar310 = pmaddwd(auVar309,auVar170);
        uVar327 = auVar267[7];
        auVar29[0xd] = 0;
        auVar29._0_13_ = auVar267._0_13_;
        auVar29[0xe] = uVar327;
        uVar318 = auVar267[6];
        auVar50[0xc] = uVar318;
        auVar50._0_12_ = auVar267._0_12_;
        auVar50._13_2_ = auVar29._13_2_;
        auVar70[0xb] = 0;
        auVar70._0_11_ = auVar267._0_11_;
        auVar70._12_3_ = auVar50._12_3_;
        uVar305 = auVar267[5];
        auVar90[10] = uVar305;
        auVar90._0_10_ = auVar267._0_10_;
        auVar90._11_4_ = auVar70._11_4_;
        auVar110[9] = 0;
        auVar110._0_9_ = auVar267._0_9_;
        auVar110._10_5_ = auVar90._10_5_;
        uVar304 = auVar267[4];
        auVar130[8] = uVar304;
        auVar130._0_8_ = auVar267._0_8_;
        auVar130._9_6_ = auVar110._9_6_;
        auVar185._7_8_ = 0;
        auVar185._0_7_ = auVar130._8_7_;
        uVar297 = auVar267[3];
        auVar215._1_8_ = SUB158(auVar185 << 0x40,7);
        auVar215[0] = uVar297;
        auVar215._9_6_ = 0;
        auVar216._1_10_ = SUB1510(auVar215 << 0x30,5);
        auVar216[0] = auVar267[2];
        auVar216._11_4_ = 0;
        auVar150[2] = auVar267[1];
        auVar150._0_2_ = auVar267._0_2_;
        auVar150._3_12_ = SUB1512(auVar216 << 0x20,3);
        auVar322._0_2_ = auVar267._0_2_ & 0xff;
        auVar322._2_13_ = auVar150._2_13_;
        auVar322[0xf] = 0;
        auVar323 = pmaddwd(auVar322,auVar171);
        uVar346 = auVar267[9];
        auVar30[0xd] = 0;
        auVar30._0_13_ = auVar267._2_13_;
        auVar30[0xe] = uVar346;
        uVar344 = auVar267[8];
        auVar51[0xc] = uVar344;
        auVar51._0_12_ = auVar267._2_12_;
        auVar51._13_2_ = auVar30._13_2_;
        auVar71[0xb] = 0;
        auVar71._0_11_ = auVar267._2_11_;
        auVar71._12_3_ = auVar51._12_3_;
        auVar91[10] = uVar327;
        auVar91._0_10_ = auVar267._2_10_;
        auVar91._11_4_ = auVar71._11_4_;
        auVar111[9] = 0;
        auVar111._0_9_ = auVar267._2_9_;
        auVar111._10_5_ = auVar91._10_5_;
        auVar131[8] = uVar318;
        auVar131._0_8_ = auVar267._2_8_;
        auVar131._9_6_ = auVar111._9_6_;
        auVar186._7_8_ = 0;
        auVar186._0_7_ = auVar131._8_7_;
        auVar217._1_8_ = SUB158(auVar186 << 0x40,7);
        auVar217[0] = uVar305;
        auVar217._9_6_ = 0;
        auVar218._1_10_ = SUB1510(auVar217 << 0x30,5);
        auVar218[0] = uVar304;
        auVar218._11_4_ = 0;
        auVar151[2] = uVar297;
        auVar151._0_2_ = auVar267._2_2_;
        auVar151._3_12_ = SUB1512(auVar218 << 0x20,3);
        auVar328._0_2_ = auVar267._2_2_ & 0xff;
        auVar328._2_13_ = auVar151._2_13_;
        auVar328[0xf] = 0;
        auVar329 = pmaddwd(auVar328,auVar172);
        auVar347._0_12_ = auVar267._4_12_;
        auVar347._12_4_ = auVar267._12_4_;
        uVar356 = auVar267[0xb];
        auVar31[0xd] = 0;
        auVar31._0_13_ = auVar347._0_13_;
        auVar31[0xe] = uVar356;
        uVar355 = auVar267[10];
        auVar52[0xc] = uVar355;
        auVar52._0_12_ = auVar347._0_12_;
        auVar52._13_2_ = auVar31._13_2_;
        auVar72[0xb] = 0;
        auVar72._0_11_ = auVar267._4_11_;
        auVar72._12_3_ = auVar52._12_3_;
        auVar92[10] = uVar346;
        auVar92._0_10_ = auVar267._4_10_;
        auVar92._11_4_ = auVar72._11_4_;
        auVar112[9] = 0;
        auVar112._0_9_ = auVar267._4_9_;
        auVar112._10_5_ = auVar92._10_5_;
        auVar132[8] = uVar344;
        auVar132._0_8_ = auVar267._4_8_;
        auVar132._9_6_ = auVar112._9_6_;
        auVar187._7_8_ = 0;
        auVar187._0_7_ = auVar132._8_7_;
        auVar219._1_8_ = SUB158(auVar187 << 0x40,7);
        auVar219[0] = uVar327;
        auVar219._9_6_ = 0;
        auVar220._1_10_ = SUB1510(auVar219 << 0x30,5);
        auVar220[0] = uVar318;
        auVar220._11_4_ = 0;
        auVar152[2] = uVar305;
        auVar152._0_2_ = auVar267._4_2_;
        auVar152._3_12_ = SUB1512(auVar220 << 0x20,3);
        auVar348._0_2_ = auVar267._4_2_ & 0xff;
        auVar348._2_13_ = auVar152._2_13_;
        auVar348[0xf] = 0;
        auVar349 = pmaddwd(auVar348,auVar173);
        auVar21 = auVar267._3_13_;
        auVar32[0xd] = 0;
        auVar32._0_13_ = auVar21 >> 0x18;
        auVar32[0xe] = auVar267[0xd];
        uVar345 = auVar267[0xc];
        auVar53[0xc] = uVar345;
        auVar53._0_12_ = auVar347._0_12_ >> 0x10;
        auVar53._13_2_ = auVar32._13_2_;
        auVar42 = auVar267._5_11_;
        auVar73[0xb] = 0;
        auVar73._0_11_ = auVar42 >> 8;
        auVar73._12_3_ = auVar53._12_3_;
        auVar93[10] = uVar356;
        auVar93._0_10_ = auVar267._6_10_;
        auVar93._11_4_ = auVar73._11_4_;
        auVar113[9] = 0;
        auVar113._0_9_ = auVar267._6_9_;
        auVar113._10_5_ = auVar93._10_5_;
        auVar133[8] = uVar355;
        auVar133._0_8_ = auVar267._6_8_;
        auVar133._9_6_ = auVar113._9_6_;
        auVar188._7_8_ = 0;
        auVar188._0_7_ = auVar133._8_7_;
        auVar221._1_8_ = SUB158(auVar188 << 0x40,7);
        auVar221[0] = uVar346;
        auVar221._9_6_ = 0;
        auVar222._1_10_ = SUB1510(auVar221 << 0x30,5);
        auVar222[0] = uVar344;
        auVar222._11_4_ = 0;
        auVar153[2] = uVar327;
        auVar153._0_2_ = auVar267._6_2_;
        auVar153._3_12_ = SUB1512(auVar222 << 0x20,3);
        auVar330._0_2_ = auVar267._6_2_ & 0xff;
        auVar330._2_13_ = auVar153._2_13_;
        auVar330[0xf] = 0;
        auVar331 = pmaddwd(auVar330,auVar174);
        auVar285._0_4_ =
             auVar284._0_4_ + iVar235 + auVar310._0_4_ + auVar323._0_4_ +
             auVar349._0_4_ + auVar329._0_4_ + auVar331._0_4_ >> auVar261;
        auVar285._4_4_ =
             auVar284._4_4_ + iVar235 + auVar310._4_4_ + auVar323._4_4_ +
             auVar349._4_4_ + auVar329._4_4_ + auVar331._4_4_ >> auVar261;
        auVar285._8_4_ =
             auVar284._8_4_ + iVar235 + auVar310._8_4_ + auVar323._8_4_ +
             auVar349._8_4_ + auVar329._8_4_ + auVar331._8_4_ >> auVar261;
        auVar285._12_4_ =
             auVar284._12_4_ + iVar235 + auVar310._12_4_ + auVar323._12_4_ +
             auVar349._12_4_ + auVar329._12_4_ + auVar331._12_4_ >> auVar261;
        auVar33[0xd] = 0;
        auVar33._0_13_ = auVar295._1_13_;
        auVar33[0xe] = uVar296;
        auVar54[0xc] = uVar277;
        auVar54._0_12_ = auVar295._1_12_;
        auVar54._13_2_ = auVar33._13_2_;
        auVar74[0xb] = 0;
        auVar74._0_11_ = auVar295._1_11_;
        auVar74._12_3_ = auVar54._12_3_;
        auVar94[10] = uVar276;
        auVar94._0_10_ = auVar295._1_10_;
        auVar94._11_4_ = auVar74._11_4_;
        auVar114[9] = 0;
        auVar114._0_9_ = auVar295._1_9_;
        auVar114._10_5_ = auVar94._10_5_;
        auVar134[8] = uVar275;
        auVar134._0_8_ = auVar295._1_8_;
        auVar134._9_6_ = auVar114._9_6_;
        auVar189._7_8_ = 0;
        auVar189._0_7_ = auVar134._8_7_;
        auVar223._1_8_ = SUB158(auVar189 << 0x40,7);
        auVar223[0] = uVar274;
        auVar223._9_6_ = 0;
        auVar224._1_10_ = SUB1510(auVar223 << 0x30,5);
        auVar224[0] = uVar273;
        auVar224._11_4_ = 0;
        auVar154[2] = auVar295[2];
        auVar154._0_2_ = auVar295._1_2_;
        auVar154._3_12_ = SUB1512(auVar224 << 0x20,3);
        auVar311._0_2_ = auVar295._1_2_ & 0xff;
        auVar311._2_13_ = auVar154._2_13_;
        auVar311[0xf] = 0;
        auVar310 = pmaddwd(auVar311,auVar169);
        auVar34[0xd] = 0;
        auVar34._0_13_ = auVar295._3_13_;
        auVar34[0xe] = auVar295[10];
        auVar55[0xc] = auVar295[9];
        auVar55._0_12_ = auVar295._3_12_;
        auVar55._13_2_ = auVar34._13_2_;
        auVar75[0xb] = 0;
        auVar75._0_11_ = auVar295._3_11_;
        auVar75._12_3_ = auVar55._12_3_;
        auVar95[10] = uVar296;
        auVar95._0_10_ = auVar295._3_10_;
        auVar95._11_4_ = auVar75._11_4_;
        auVar115[9] = 0;
        auVar115._0_9_ = auVar295._3_9_;
        auVar115._10_5_ = auVar95._10_5_;
        auVar135[8] = uVar277;
        auVar135._0_8_ = auVar295._3_8_;
        auVar135._9_6_ = auVar115._9_6_;
        auVar190._7_8_ = 0;
        auVar190._0_7_ = auVar135._8_7_;
        auVar225._1_8_ = SUB158(auVar190 << 0x40,7);
        auVar225[0] = uVar276;
        auVar225._9_6_ = 0;
        auVar226._1_10_ = SUB1510(auVar225 << 0x30,5);
        auVar226[0] = uVar275;
        auVar226._11_4_ = 0;
        auVar155[2] = uVar274;
        auVar155._0_2_ = auVar295._3_2_;
        auVar155._3_12_ = SUB1512(auVar226 << 0x20,3);
        auVar302._0_2_ = auVar295._3_2_ & 0xff;
        auVar302._2_13_ = auVar155._2_13_;
        auVar302[0xf] = 0;
        auVar284 = pmaddwd(auVar302,auVar170);
        auVar35[0xd] = 0;
        auVar35._0_13_ = auVar267._1_13_;
        auVar35[0xe] = uVar344;
        auVar56[0xc] = uVar327;
        auVar56._0_12_ = auVar267._1_12_;
        auVar56._13_2_ = auVar35._13_2_;
        auVar76[0xb] = 0;
        auVar76._0_11_ = auVar267._1_11_;
        auVar76._12_3_ = auVar56._12_3_;
        auVar96[10] = uVar318;
        auVar96._0_10_ = auVar267._1_10_;
        auVar96._11_4_ = auVar76._11_4_;
        auVar116[9] = 0;
        auVar116._0_9_ = auVar267._1_9_;
        auVar116._10_5_ = auVar96._10_5_;
        auVar136[8] = uVar305;
        auVar136._0_8_ = auVar267._1_8_;
        auVar136._9_6_ = auVar116._9_6_;
        auVar191._7_8_ = 0;
        auVar191._0_7_ = auVar136._8_7_;
        auVar227._1_8_ = SUB158(auVar191 << 0x40,7);
        auVar227[0] = uVar304;
        auVar227._9_6_ = 0;
        auVar228._1_10_ = SUB1510(auVar227 << 0x30,5);
        auVar228[0] = uVar297;
        auVar228._11_4_ = 0;
        auVar156[2] = auVar267[2];
        auVar156._0_2_ = auVar267._1_2_;
        auVar156._3_12_ = SUB1512(auVar228 << 0x20,3);
        auVar324._0_2_ = auVar267._1_2_ & 0xff;
        auVar324._2_13_ = auVar156._2_13_;
        auVar324[0xf] = 0;
        auVar323 = pmaddwd(auVar324,auVar171);
        auVar36[0xd] = 0;
        auVar36._0_13_ = auVar21;
        auVar36[0xe] = uVar355;
        auVar57[0xc] = uVar346;
        auVar57._0_12_ = auVar267._3_12_;
        auVar57._13_2_ = auVar36._13_2_;
        auVar77[0xb] = 0;
        auVar77._0_11_ = auVar267._3_11_;
        auVar77._12_3_ = auVar57._12_3_;
        auVar97[10] = uVar344;
        auVar97._0_10_ = auVar267._3_10_;
        auVar97._11_4_ = auVar77._11_4_;
        auVar117[9] = 0;
        auVar117._0_9_ = auVar267._3_9_;
        auVar117._10_5_ = auVar97._10_5_;
        auVar137[8] = uVar327;
        auVar137._0_8_ = auVar267._3_8_;
        auVar137._9_6_ = auVar117._9_6_;
        auVar192._7_8_ = 0;
        auVar192._0_7_ = auVar137._8_7_;
        auVar229._1_8_ = SUB158(auVar192 << 0x40,7);
        auVar229[0] = uVar318;
        auVar229._9_6_ = 0;
        auVar230._1_10_ = SUB1510(auVar229 << 0x30,5);
        auVar230[0] = uVar305;
        auVar230._11_4_ = 0;
        auVar157[2] = uVar304;
        auVar157._0_2_ = auVar267._3_2_;
        auVar157._3_12_ = SUB1512(auVar230 << 0x20,3);
        auVar332._0_2_ = auVar267._3_2_ & 0xff;
        auVar332._2_13_ = auVar157._2_13_;
        auVar332[0xf] = 0;
        auVar331 = pmaddwd(auVar332,auVar172);
        auVar37[0xd] = 0;
        auVar37._0_13_ = auVar21 >> 0x10;
        auVar37[0xe] = uVar345;
        auVar58[0xc] = uVar356;
        auVar58._0_12_ = auVar347._0_12_ >> 8;
        auVar58._13_2_ = auVar37._13_2_;
        auVar78[0xb] = 0;
        auVar78._0_11_ = auVar42;
        auVar78._12_3_ = auVar58._12_3_;
        auVar98[10] = uVar355;
        auVar98._0_10_ = auVar267._5_10_;
        auVar98._11_4_ = auVar78._11_4_;
        auVar118[9] = 0;
        auVar118._0_9_ = auVar267._5_9_;
        auVar118._10_5_ = auVar98._10_5_;
        auVar138[8] = uVar346;
        auVar138._0_8_ = auVar267._5_8_;
        auVar138._9_6_ = auVar118._9_6_;
        auVar193._7_8_ = 0;
        auVar193._0_7_ = auVar138._8_7_;
        auVar231._1_8_ = SUB158(auVar193 << 0x40,7);
        auVar231[0] = uVar344;
        auVar231._9_6_ = 0;
        auVar232._1_10_ = SUB1510(auVar231 << 0x30,5);
        auVar232[0] = uVar327;
        auVar232._11_4_ = 0;
        auVar158[2] = uVar318;
        auVar158._0_2_ = auVar267._5_2_;
        auVar158._3_12_ = SUB1512(auVar232 << 0x20,3);
        auVar325._0_2_ = auVar267._5_2_ & 0xff;
        auVar325._2_13_ = auVar158._2_13_;
        auVar325[0xf] = 0;
        auVar329 = pmaddwd(auVar325,auVar173);
        auVar38[0xd] = 0;
        auVar38._0_13_ = auVar21 >> 0x20;
        auVar38[0xe] = auVar267[0xe];
        auVar59[0xc] = auVar267[0xd];
        auVar59._0_12_ = auVar347._0_12_ >> 0x18;
        auVar59._13_2_ = auVar38._13_2_;
        auVar79[0xb] = 0;
        auVar79._0_11_ = auVar42 >> 0x10;
        auVar79._12_3_ = auVar59._12_3_;
        auVar99[10] = uVar345;
        auVar99._0_10_ = auVar267._6_10_ >> 8;
        auVar99._11_4_ = auVar79._11_4_;
        auVar119[9] = 0;
        auVar119._0_9_ = auVar267._7_9_;
        auVar119._10_5_ = auVar99._10_5_;
        auVar139[8] = uVar356;
        auVar139._0_8_ = auVar267._7_8_;
        auVar139._9_6_ = auVar119._9_6_;
        auVar194._7_8_ = 0;
        auVar194._0_7_ = auVar139._8_7_;
        auVar233._1_8_ = SUB158(auVar194 << 0x40,7);
        auVar233[0] = uVar355;
        auVar233._9_6_ = 0;
        auVar234._1_10_ = SUB1510(auVar233 << 0x30,5);
        auVar234[0] = uVar346;
        auVar234._11_4_ = 0;
        auVar159[2] = uVar344;
        auVar159._0_2_ = auVar267._7_2_;
        auVar159._3_12_ = SUB1512(auVar234 << 0x20,3);
        auVar294._0_2_ = auVar267._7_2_ & 0xff;
        auVar294._2_13_ = auVar159._2_13_;
        auVar294[0xf] = 0;
        auVar295 = pmaddwd(auVar294,auVar174);
        auVar312._0_4_ =
             auVar310._0_4_ + iVar235 + auVar284._0_4_ + auVar331._0_4_ + auVar323._0_4_ +
             auVar295._0_4_ + auVar329._0_4_ >> auVar261;
        auVar312._4_4_ =
             auVar310._4_4_ + iVar235 + auVar284._4_4_ + auVar331._4_4_ + auVar323._4_4_ +
             auVar295._4_4_ + auVar329._4_4_ >> auVar261;
        auVar312._8_4_ =
             auVar310._8_4_ + iVar235 + auVar284._8_4_ + auVar331._8_4_ + auVar323._8_4_ +
             auVar295._8_4_ + auVar329._8_4_ >> auVar261;
        auVar312._12_4_ =
             auVar310._12_4_ + iVar235 + auVar284._12_4_ + auVar331._12_4_ + auVar323._12_4_ +
             auVar295._12_4_ + auVar329._12_4_ >> auVar261;
        auVar295 = packssdw(auVar285,auVar312);
        *(undefined1 (*) [16])(piVar237 + uVar253) = auVar295;
        lVar251 = lVar251 + 0x800000000;
      }
      piVar237 = piVar237 + uVar259;
      lVar248 = lVar248 + ((long)src_stride << 0x20);
      puVar257 = puVar257 + src_stride;
    }
    uVar239 = 0xe - (uVar9 + iVar247);
    bVar238 = 0x16 - bVar238;
    prepare_coeffs_12tap(filter_params_y,subpel_y_qn,(__m128i *)&local_8b98);
    iVar235 = ((1 << ((byte)uVar9 & 0x1f)) >> 1) + (1 << (bVar238 & 0x1f));
    auVar261 = ZEXT416(uVar9);
    iVar247 = 1 << (bVar238 - (byte)uVar9 & 0x1f);
    iVar247 = ((1 << ((byte)uVar239 & 0x1f)) >> 1) - ((iVar247 >> 1) + iVar247);
    auVar295 = ZEXT416(uVar239);
    local_8cc0 = 0;
    uVar240 = (ulong)(uint)h;
    if (h < 1) {
      uVar240 = 0;
    }
    piVar242 = im_block + (uint)(w * 0xb);
    piVar246 = im_block + (uint)(w * 10);
    piVar249 = im_block + (uint)(w * 9);
    piVar250 = im_block + (uint)(w * 8);
    piVar252 = im_block + (uint)(w * 7);
    piVar254 = im_block + (uint)(w * 6);
    piVar255 = im_block + (uint)(w * 5);
    piVar243 = im_block + (uint)(w * 4);
    piVar260 = im_block + (uint)(w * 3);
    piVar244 = im_block + (uint)(w * 2);
    piVar258 = im_block;
    piVar237 = im_block;
    auVar168._8_8_ = lStack_8b90;
    auVar168._0_8_ = local_8b98;
    auVar167._8_8_ = uStack_8b80;
    auVar167._0_8_ = local_8b88;
    auVar165._8_8_ = uStack_8b60;
    auVar165._0_8_ = local_8b68;
    for (; piVar258 = piVar258 + uVar259, local_8cc0 != uVar240; local_8cc0 = local_8cc0 + 1) {
      for (uVar241 = 0; uVar241 < uVar259; uVar241 = uVar241 + 8) {
        auVar267 = *(undefined1 (*) [16])(piVar237 + uVar241);
        piVar1 = piVar258 + uVar241;
        auVar265._0_12_ = auVar267._0_12_;
        auVar265._12_2_ = auVar267._6_2_;
        auVar265._14_2_ = piVar1[3];
        auVar264._12_4_ = auVar265._12_4_;
        auVar264._0_10_ = auVar267._0_10_;
        auVar264._10_2_ = piVar1[2];
        auVar263._10_6_ = auVar264._10_6_;
        auVar263._0_8_ = auVar267._0_8_;
        auVar263._8_2_ = auVar267._4_2_;
        auVar262._8_8_ = auVar263._8_8_;
        auVar262._6_2_ = piVar1[1];
        auVar262._4_2_ = auVar267._2_2_;
        auVar262._0_2_ = auVar267._0_2_;
        auVar262._2_2_ = *piVar1;
        auVar284 = *(undefined1 (*) [16])(piVar244 + uVar241);
        piVar2 = piVar260 + uVar241;
        auVar336._0_12_ = auVar284._0_12_;
        auVar336._12_2_ = auVar284._6_2_;
        auVar336._14_2_ = piVar2[3];
        auVar335._12_4_ = auVar336._12_4_;
        auVar335._0_10_ = auVar284._0_10_;
        auVar335._10_2_ = piVar2[2];
        auVar334._10_6_ = auVar335._10_6_;
        auVar334._0_8_ = auVar284._0_8_;
        auVar334._8_2_ = auVar284._4_2_;
        auVar333._8_8_ = auVar334._8_8_;
        auVar333._6_2_ = piVar2[1];
        auVar333._4_2_ = auVar284._2_2_;
        auVar333._0_2_ = auVar284._0_2_;
        auVar333._2_2_ = *piVar2;
        auVar310 = *(undefined1 (*) [16])(piVar243 + uVar241);
        piVar3 = piVar255 + uVar241;
        auVar353._0_12_ = auVar310._0_12_;
        auVar353._12_2_ = auVar310._6_2_;
        auVar353._14_2_ = piVar3[3];
        auVar352._12_4_ = auVar353._12_4_;
        auVar352._0_10_ = auVar310._0_10_;
        auVar352._10_2_ = piVar3[2];
        auVar351._10_6_ = auVar352._10_6_;
        auVar351._0_8_ = auVar310._0_8_;
        auVar351._8_2_ = auVar310._4_2_;
        auVar350._8_8_ = auVar351._8_8_;
        auVar350._6_2_ = piVar3[1];
        auVar350._4_2_ = auVar310._2_2_;
        auVar350._0_2_ = auVar310._0_2_;
        auVar350._2_2_ = *piVar3;
        auVar323 = *(undefined1 (*) [16])(piVar254 + uVar241);
        piVar4 = piVar252 + uVar241;
        auVar316._0_12_ = auVar323._0_12_;
        auVar316._12_2_ = auVar323._6_2_;
        auVar316._14_2_ = piVar4[3];
        auVar315._12_4_ = auVar316._12_4_;
        auVar315._0_10_ = auVar323._0_10_;
        auVar315._10_2_ = piVar4[2];
        auVar314._10_6_ = auVar315._10_6_;
        auVar314._0_8_ = auVar323._0_8_;
        auVar314._8_2_ = auVar323._4_2_;
        auVar313._8_8_ = auVar314._8_8_;
        auVar313._6_2_ = piVar4[1];
        auVar313._4_2_ = auVar323._2_2_;
        auVar313._0_2_ = auVar323._0_2_;
        auVar313._2_2_ = *piVar4;
        auVar329 = *(undefined1 (*) [16])(piVar250 + uVar241);
        piVar5 = piVar249 + uVar241;
        auVar365._0_12_ = auVar329._0_12_;
        auVar365._12_2_ = auVar329._6_2_;
        auVar365._14_2_ = piVar5[3];
        auVar364._12_4_ = auVar365._12_4_;
        auVar364._0_10_ = auVar329._0_10_;
        auVar364._10_2_ = piVar5[2];
        auVar363._10_6_ = auVar364._10_6_;
        auVar363._0_8_ = auVar329._0_8_;
        auVar363._8_2_ = auVar329._4_2_;
        auVar362._8_8_ = auVar363._8_8_;
        auVar362._6_2_ = piVar5[1];
        auVar362._4_2_ = auVar329._2_2_;
        auVar362._0_2_ = auVar329._0_2_;
        auVar362._2_2_ = *piVar5;
        auVar349 = pmaddwd(auVar262,auVar168);
        auVar337 = pmaddwd(auVar333,auVar167);
        auVar331 = *(undefined1 (*) [16])(piVar246 + uVar241);
        auVar166._8_8_ = uStack_8b70;
        auVar166._0_8_ = local_8b78;
        auVar354 = pmaddwd(auVar350,auVar166);
        auVar317 = pmaddwd(auVar313,auVar165);
        piVar6 = piVar242 + uVar241;
        auVar341._0_12_ = auVar331._0_12_;
        auVar341._12_2_ = auVar331._6_2_;
        auVar341._14_2_ = piVar6[3];
        auVar340._12_4_ = auVar341._12_4_;
        auVar340._0_10_ = auVar331._0_10_;
        auVar340._10_2_ = piVar6[2];
        auVar339._10_6_ = auVar340._10_6_;
        auVar339._0_8_ = auVar331._0_8_;
        auVar339._8_2_ = auVar331._4_2_;
        auVar338._8_8_ = auVar339._8_8_;
        auVar338._6_2_ = piVar6[1];
        auVar338._4_2_ = auVar331._2_2_;
        auVar338._0_2_ = auVar331._0_2_;
        auVar338._2_2_ = *piVar6;
        auVar164._8_8_ = uStack_8b50;
        auVar164._0_8_ = local_8b58;
        auVar366 = pmaddwd(auVar362,auVar164);
        auVar163._8_8_ = uStack_8b40;
        auVar163._0_8_ = local_8b48;
        auVar342 = pmaddwd(auVar338,auVar163);
        auVar326._2_2_ = piVar1[4];
        auVar326._0_2_ = auVar267._8_2_;
        auVar326._4_2_ = auVar267._10_2_;
        auVar326._6_2_ = piVar1[5];
        auVar326._8_2_ = auVar267._12_2_;
        auVar326._10_2_ = piVar1[6];
        auVar326._12_2_ = auVar267._14_2_;
        auVar326._14_2_ = piVar1[7];
        auVar303._2_2_ = piVar2[4];
        auVar303._0_2_ = auVar284._8_2_;
        auVar303._4_2_ = auVar284._10_2_;
        auVar303._6_2_ = piVar2[5];
        auVar303._8_2_ = auVar284._12_2_;
        auVar303._10_2_ = piVar2[6];
        auVar303._12_2_ = auVar284._14_2_;
        auVar303._14_2_ = piVar2[7];
        auVar272._2_2_ = piVar3[4];
        auVar272._0_2_ = auVar310._8_2_;
        auVar272._4_2_ = auVar310._10_2_;
        auVar272._6_2_ = piVar3[5];
        auVar272._8_2_ = auVar310._12_2_;
        auVar272._10_2_ = piVar3[6];
        auVar272._12_2_ = auVar310._14_2_;
        auVar272._14_2_ = piVar3[7];
        auVar269._2_2_ = piVar4[4];
        auVar269._0_2_ = auVar323._8_2_;
        auVar269._4_2_ = auVar323._10_2_;
        auVar269._6_2_ = piVar4[5];
        auVar269._8_2_ = auVar323._12_2_;
        auVar269._10_2_ = piVar4[6];
        auVar269._12_2_ = auVar323._14_2_;
        auVar269._14_2_ = piVar4[7];
        auVar286._2_2_ = piVar5[4];
        auVar286._0_2_ = auVar329._8_2_;
        auVar286._4_2_ = auVar329._10_2_;
        auVar286._6_2_ = piVar5[5];
        auVar286._8_2_ = auVar329._12_2_;
        auVar286._10_2_ = piVar5[6];
        auVar286._12_2_ = auVar329._14_2_;
        auVar286._14_2_ = piVar5[7];
        auVar266._2_2_ = piVar6[4];
        auVar266._0_2_ = auVar331._8_2_;
        auVar266._4_2_ = auVar331._10_2_;
        auVar266._6_2_ = piVar6[5];
        auVar266._8_2_ = auVar331._12_2_;
        auVar266._10_2_ = piVar6[6];
        auVar266._12_2_ = auVar331._14_2_;
        auVar266._14_2_ = piVar6[7];
        auVar331 = pmaddwd(auVar326,auVar168);
        auVar329 = pmaddwd(auVar303,auVar167);
        auVar310 = pmaddwd(auVar272,auVar166);
        auVar284 = pmaddwd(auVar269,auVar165);
        auVar323 = pmaddwd(auVar286,auVar164);
        auVar267 = pmaddwd(auVar266,auVar163);
        auVar268._0_4_ =
             (auVar342._0_4_ + auVar366._0_4_ +
              auVar317._0_4_ + auVar354._0_4_ + auVar337._0_4_ + auVar349._0_4_ + iVar235 >>
             auVar261) + iVar247 >> auVar295;
        auVar268._4_4_ =
             (auVar267._0_4_ + auVar323._0_4_ +
              auVar284._0_4_ + auVar310._0_4_ + auVar329._0_4_ + auVar331._0_4_ + iVar235 >>
             auVar261) + iVar247 >> auVar295;
        auVar268._8_4_ =
             (auVar342._4_4_ + auVar366._4_4_ +
              auVar317._4_4_ + auVar354._4_4_ + auVar337._4_4_ + auVar349._4_4_ + iVar235 >>
             auVar261) + iVar247 >> auVar295;
        auVar268._12_4_ =
             (auVar267._4_4_ + auVar323._4_4_ +
              auVar284._4_4_ + auVar310._4_4_ + auVar329._4_4_ + auVar331._4_4_ + iVar235 >>
             auVar261) + iVar247 >> auVar295;
        auVar343._0_4_ =
             (auVar342._8_4_ + auVar366._8_4_ +
              auVar317._8_4_ + auVar354._8_4_ + auVar337._8_4_ + auVar349._8_4_ + iVar235 >>
             auVar261) + iVar247 >> auVar295;
        auVar343._4_4_ =
             (auVar267._8_4_ + auVar323._8_4_ +
              auVar284._8_4_ + auVar310._8_4_ + auVar329._8_4_ + auVar331._8_4_ + iVar235 >>
             auVar261) + iVar247 >> auVar295;
        auVar343._8_4_ =
             (auVar342._12_4_ + auVar366._12_4_ +
              auVar317._12_4_ + auVar354._12_4_ + auVar337._12_4_ + auVar349._12_4_ + iVar235 >>
             auVar261) + iVar247 >> auVar295;
        auVar343._12_4_ =
             (auVar267._12_4_ + auVar323._12_4_ +
              auVar284._12_4_ + auVar310._12_4_ + auVar329._12_4_ + auVar331._12_4_ + iVar235 >>
             auVar261) + iVar247 >> auVar295;
        auVar267 = packssdw(auVar268,auVar343);
        sVar10 = auVar267._0_2_;
        sVar11 = auVar267._2_2_;
        sVar12 = auVar267._4_2_;
        sVar13 = auVar267._6_2_;
        sVar14 = auVar267._8_2_;
        sVar15 = auVar267._10_2_;
        sVar16 = auVar267._12_2_;
        sVar17 = auVar267._14_2_;
        *(ulong *)(dst + uVar241) =
             CONCAT17((0 < sVar17) * (sVar17 < 0x100) * auVar267[0xe] - (0xff < sVar17),
                      CONCAT16((0 < sVar16) * (sVar16 < 0x100) * auVar267[0xc] - (0xff < sVar16),
                               CONCAT15((0 < sVar15) * (sVar15 < 0x100) * auVar267[10] -
                                        (0xff < sVar15),
                                        CONCAT14((0 < sVar14) * (sVar14 < 0x100) * auVar267[8] -
                                                 (0xff < sVar14),
                                                 CONCAT13((0 < sVar13) * (sVar13 < 0x100) *
                                                          auVar267[6] - (0xff < sVar13),
                                                          CONCAT12((0 < sVar12) * (sVar12 < 0x100) *
                                                                   auVar267[4] - (0xff < sVar12),
                                                                   CONCAT11((0 < sVar11) *
                                                                            (sVar11 < 0x100) *
                                                                            auVar267[2] -
                                                                            (0xff < sVar11),
                                                                            (0 < sVar10) *
                                                                            (sVar10 < 0x100) *
                                                                            auVar267[0] -
                                                                            (0xff < sVar10))))))));
      }
      dst = dst + dst_stride;
      piVar242 = piVar242 + uVar259;
      piVar246 = piVar246 + uVar259;
      piVar249 = piVar249 + uVar259;
      piVar250 = piVar250 + uVar259;
      piVar252 = piVar252 + uVar259;
      piVar254 = piVar254 + uVar259;
      piVar255 = piVar255 + uVar259;
      piVar243 = piVar243 + uVar259;
      piVar260 = piVar260 + uVar259;
      piVar244 = piVar244 + uVar259;
      piVar237 = piVar237 + uVar259;
    }
  }
  return;
}

Assistant:

void av1_convolve_2d_sr_sse2(const uint8_t *src, int src_stride, uint8_t *dst,
                             int dst_stride, int w, int h,
                             const InterpFilterParams *filter_params_x,
                             const InterpFilterParams *filter_params_y,
                             const int subpel_x_qn, const int subpel_y_qn,
                             ConvolveParams *conv_params) {
  if (filter_params_x->taps > 8) {
    if (w < 8) {
      av1_convolve_2d_sr_c(src, src_stride, dst, dst_stride, w, h,
                           filter_params_x, filter_params_y, subpel_x_qn,
                           subpel_y_qn, conv_params);
    } else {
      convolve_2d_sr_12tap_sse2(src, src_stride, dst, dst_stride, w, h,
                                filter_params_x, filter_params_y, subpel_x_qn,
                                subpel_y_qn, conv_params);
    }
  } else {
    const int bd = 8;

    DECLARE_ALIGNED(16, int16_t,
                    im_block[(MAX_SB_SIZE + MAX_FILTER_TAP - 1) * MAX_SB_SIZE]);
    int im_h = h + filter_params_y->taps - 1;
    int im_stride = MAX_SB_SIZE;
    int i, j;
    const int fo_vert = filter_params_y->taps / 2 - 1;
    const int fo_horiz = filter_params_x->taps / 2 - 1;
    const uint8_t *const src_ptr = src - fo_vert * src_stride - fo_horiz;

    const __m128i zero = _mm_setzero_si128();
    const int bits =
        FILTER_BITS * 2 - conv_params->round_0 - conv_params->round_1;
    const int offset_bits = bd + 2 * FILTER_BITS - conv_params->round_0;

    assert(conv_params->round_0 > 0);

    /* Horizontal filter */
    {
      const int16_t *x_filter = av1_get_interp_filter_subpel_kernel(
          filter_params_x, subpel_x_qn & SUBPEL_MASK);
      const __m128i coeffs_x = _mm_loadu_si128((__m128i *)x_filter);

      // coeffs 0 1 0 1 2 3 2 3
      const __m128i tmp_0 = _mm_unpacklo_epi32(coeffs_x, coeffs_x);
      // coeffs 4 5 4 5 6 7 6 7
      const __m128i tmp_1 = _mm_unpackhi_epi32(coeffs_x, coeffs_x);

      // coeffs 0 1 0 1 0 1 0 1
      const __m128i coeff_01 = _mm_unpacklo_epi64(tmp_0, tmp_0);
      // coeffs 2 3 2 3 2 3 2 3
      const __m128i coeff_23 = _mm_unpackhi_epi64(tmp_0, tmp_0);
      // coeffs 4 5 4 5 4 5 4 5
      const __m128i coeff_45 = _mm_unpacklo_epi64(tmp_1, tmp_1);
      // coeffs 6 7 6 7 6 7 6 7
      const __m128i coeff_67 = _mm_unpackhi_epi64(tmp_1, tmp_1);

      const __m128i round_const = _mm_set1_epi32(
          (1 << (bd + FILTER_BITS - 1)) + ((1 << conv_params->round_0) >> 1));
      const __m128i round_shift = _mm_cvtsi32_si128(conv_params->round_0);

      for (i = 0; i < im_h; ++i) {
        for (j = 0; j < w; j += 8) {
          const __m128i data =
              _mm_loadu_si128((__m128i *)&src_ptr[i * src_stride + j]);

          // Filter even-index pixels
          const __m128i src_0 = _mm_unpacklo_epi8(data, zero);
          const __m128i res_0 = _mm_madd_epi16(src_0, coeff_01);
          const __m128i src_2 =
              _mm_unpacklo_epi8(_mm_srli_si128(data, 2), zero);
          const __m128i res_2 = _mm_madd_epi16(src_2, coeff_23);
          const __m128i src_4 =
              _mm_unpacklo_epi8(_mm_srli_si128(data, 4), zero);
          const __m128i res_4 = _mm_madd_epi16(src_4, coeff_45);
          const __m128i src_6 =
              _mm_unpacklo_epi8(_mm_srli_si128(data, 6), zero);
          const __m128i res_6 = _mm_madd_epi16(src_6, coeff_67);

          __m128i res_even = _mm_add_epi32(_mm_add_epi32(res_0, res_4),
                                           _mm_add_epi32(res_2, res_6));
          res_even =
              _mm_sra_epi32(_mm_add_epi32(res_even, round_const), round_shift);

          // Filter odd-index pixels
          const __m128i src_1 =
              _mm_unpacklo_epi8(_mm_srli_si128(data, 1), zero);
          const __m128i res_1 = _mm_madd_epi16(src_1, coeff_01);
          const __m128i src_3 =
              _mm_unpacklo_epi8(_mm_srli_si128(data, 3), zero);
          const __m128i res_3 = _mm_madd_epi16(src_3, coeff_23);
          const __m128i src_5 =
              _mm_unpacklo_epi8(_mm_srli_si128(data, 5), zero);
          const __m128i res_5 = _mm_madd_epi16(src_5, coeff_45);
          const __m128i src_7 =
              _mm_unpacklo_epi8(_mm_srli_si128(data, 7), zero);
          const __m128i res_7 = _mm_madd_epi16(src_7, coeff_67);

          __m128i res_odd = _mm_add_epi32(_mm_add_epi32(res_1, res_5),
                                          _mm_add_epi32(res_3, res_7));
          res_odd =
              _mm_sra_epi32(_mm_add_epi32(res_odd, round_const), round_shift);

          // Pack in the column order 0, 2, 4, 6, 1, 3, 5, 7
          __m128i res = _mm_packs_epi32(res_even, res_odd);
          _mm_storeu_si128((__m128i *)&im_block[i * im_stride + j], res);
        }
      }
    }

    /* Vertical filter */
    {
      const int16_t *y_filter = av1_get_interp_filter_subpel_kernel(
          filter_params_y, subpel_y_qn & SUBPEL_MASK);
      const __m128i coeffs_y = _mm_loadu_si128((__m128i *)y_filter);

      // coeffs 0 1 0 1 2 3 2 3
      const __m128i tmp_0 = _mm_unpacklo_epi32(coeffs_y, coeffs_y);
      // coeffs 4 5 4 5 6 7 6 7
      const __m128i tmp_1 = _mm_unpackhi_epi32(coeffs_y, coeffs_y);

      // coeffs 0 1 0 1 0 1 0 1
      const __m128i coeff_01 = _mm_unpacklo_epi64(tmp_0, tmp_0);
      // coeffs 2 3 2 3 2 3 2 3
      const __m128i coeff_23 = _mm_unpackhi_epi64(tmp_0, tmp_0);
      // coeffs 4 5 4 5 4 5 4 5
      const __m128i coeff_45 = _mm_unpacklo_epi64(tmp_1, tmp_1);
      // coeffs 6 7 6 7 6 7 6 7
      const __m128i coeff_67 = _mm_unpackhi_epi64(tmp_1, tmp_1);

      const __m128i sum_round = _mm_set1_epi32(
          (1 << offset_bits) + ((1 << conv_params->round_1) >> 1));
      const __m128i sum_shift = _mm_cvtsi32_si128(conv_params->round_1);

      const __m128i round_const = _mm_set1_epi32(
          ((1 << bits) >> 1) - (1 << (offset_bits - conv_params->round_1)) -
          ((1 << (offset_bits - conv_params->round_1)) >> 1));
      const __m128i round_shift = _mm_cvtsi32_si128(bits);

      for (i = 0; i < h; ++i) {
        for (j = 0; j < w; j += 8) {
          // Filter even-index pixels
          const int16_t *data = &im_block[i * im_stride + j];
          const __m128i src_0 =
              _mm_unpacklo_epi16(*(__m128i *)(data + 0 * im_stride),
                                 *(__m128i *)(data + 1 * im_stride));
          const __m128i src_2 =
              _mm_unpacklo_epi16(*(__m128i *)(data + 2 * im_stride),
                                 *(__m128i *)(data + 3 * im_stride));
          const __m128i src_4 =
              _mm_unpacklo_epi16(*(__m128i *)(data + 4 * im_stride),
                                 *(__m128i *)(data + 5 * im_stride));
          const __m128i src_6 =
              _mm_unpacklo_epi16(*(__m128i *)(data + 6 * im_stride),
                                 *(__m128i *)(data + 7 * im_stride));

          const __m128i res_0 = _mm_madd_epi16(src_0, coeff_01);
          const __m128i res_2 = _mm_madd_epi16(src_2, coeff_23);
          const __m128i res_4 = _mm_madd_epi16(src_4, coeff_45);
          const __m128i res_6 = _mm_madd_epi16(src_6, coeff_67);

          const __m128i res_even = _mm_add_epi32(_mm_add_epi32(res_0, res_2),
                                                 _mm_add_epi32(res_4, res_6));

          // Filter odd-index pixels
          const __m128i src_1 =
              _mm_unpackhi_epi16(*(__m128i *)(data + 0 * im_stride),
                                 *(__m128i *)(data + 1 * im_stride));
          const __m128i src_3 =
              _mm_unpackhi_epi16(*(__m128i *)(data + 2 * im_stride),
                                 *(__m128i *)(data + 3 * im_stride));
          const __m128i src_5 =
              _mm_unpackhi_epi16(*(__m128i *)(data + 4 * im_stride),
                                 *(__m128i *)(data + 5 * im_stride));
          const __m128i src_7 =
              _mm_unpackhi_epi16(*(__m128i *)(data + 6 * im_stride),
                                 *(__m128i *)(data + 7 * im_stride));

          const __m128i res_1 = _mm_madd_epi16(src_1, coeff_01);
          const __m128i res_3 = _mm_madd_epi16(src_3, coeff_23);
          const __m128i res_5 = _mm_madd_epi16(src_5, coeff_45);
          const __m128i res_7 = _mm_madd_epi16(src_7, coeff_67);

          const __m128i res_odd = _mm_add_epi32(_mm_add_epi32(res_1, res_3),
                                                _mm_add_epi32(res_5, res_7));

          // Rearrange pixels back into the order 0 ... 7
          const __m128i res_lo = _mm_unpacklo_epi32(res_even, res_odd);
          const __m128i res_hi = _mm_unpackhi_epi32(res_even, res_odd);

          __m128i res_lo_round =
              _mm_sra_epi32(_mm_add_epi32(res_lo, sum_round), sum_shift);
          __m128i res_hi_round =
              _mm_sra_epi32(_mm_add_epi32(res_hi, sum_round), sum_shift);

          res_lo_round = _mm_sra_epi32(_mm_add_epi32(res_lo_round, round_const),
                                       round_shift);
          res_hi_round = _mm_sra_epi32(_mm_add_epi32(res_hi_round, round_const),
                                       round_shift);

          const __m128i res16 = _mm_packs_epi32(res_lo_round, res_hi_round);
          const __m128i res = _mm_packus_epi16(res16, res16);

          // Accumulate values into the destination buffer
          __m128i *const p = (__m128i *)&dst[i * dst_stride + j];

          if (w == 2) {
            *(uint16_t *)p = (uint16_t)_mm_cvtsi128_si32(res);
          } else if (w == 4) {
            *(int *)p = _mm_cvtsi128_si32(res);
          } else {
            _mm_storel_epi64(p, res);
          }
        }
      }
    }
  }
}